

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::float_writer<char>>
          (basic_writer<fmt::v6::buffer_range<char>_> *this,format_specs *specs,
          float_writer<char> *f)

{
  type tVar1;
  float_writer<char> *this_00;
  char *pcVar2;
  fill_t<char> *fill;
  char *pcVar3;
  float_writer<char> *in_RDX;
  int *in_RSI;
  size_t left_padding;
  checked_ptr<typename_buffer<char>::value_type> *it;
  size_t fill_size;
  size_t padding;
  size_t num_code_points;
  size_t size;
  uint width;
  char **in_stack_ffffffffffffff88;
  undefined8 *n;
  
  tVar1 = to_unsigned<int>(*in_RSI);
  this_00 = (float_writer<char> *)float_writer<char>::size(in_RDX);
  if (tVar1 != 0) {
    this_00 = (float_writer<char> *)float_writer<char>::width((float_writer<char> *)0x155b0d);
  }
  if (this_00 < (float_writer<char> *)(ulong)tVar1) {
    pcVar2 = (char *)fill_t<char>::size((fill_t<char> *)((long)in_RSI + 10));
    fill = (fill_t<char> *)
           basic_writer<fmt::v6::buffer_range<char>_>::reserve
                     ((basic_writer<fmt::v6::buffer_range<char>_> *)this_00,
                      (size_t)in_stack_ffffffffffffff88);
    n = (undefined8 *)&stack0xffffffffffffffa8;
    if ((*(byte *)((long)in_RSI + 9) & 0xf) == 2) {
      pcVar2 = fill<char*,char>(pcVar2,(size_t)n,fill);
      *n = pcVar2;
      float_writer<char>::operator()(this_00,in_stack_ffffffffffffff88);
    }
    else if ((*(byte *)((long)in_RSI + 9) & 0xf) == 3) {
      pcVar3 = fill<char*,char>(pcVar2,(size_t)n,fill);
      *n = pcVar3;
      float_writer<char>::operator()(this_00,in_stack_ffffffffffffff88);
      pcVar2 = fill<char*,char>(pcVar2,(size_t)n,fill);
      *n = pcVar2;
    }
    else {
      float_writer<char>::operator()(this_00,in_stack_ffffffffffffff88);
      pcVar2 = fill<char*,char>(pcVar2,(size_t)n,fill);
      *n = pcVar2;
    }
  }
  else {
    basic_writer<fmt::v6::buffer_range<char>_>::reserve
              ((basic_writer<fmt::v6::buffer_range<char>_> *)this_00,(size_t)in_RDX);
    float_writer<char>::operator()(this_00,&in_RDX->digits_);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }